

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

ThisType * __thiscall
Gs::Matrix<float,_3UL,_3UL>::operator*=(Matrix<float,_3UL,_3UL> *this,ThisType *rhs)

{
  Matrix<float,_3UL,_3UL> local_3c;
  ThisType *local_18;
  ThisType *rhs_local;
  Matrix<float,_3UL,_3UL> *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  Gs::operator*(&local_3c,this,rhs);
  operator=(this,&local_3c);
  return this;
}

Assistant:

ThisType& operator *= (const ThisType& rhs)
        {
            GS_ASSERT_NxN_MATRIX;
            *this = (*this * rhs);
            return *this;
        }